

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal,int bSaveRow)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  sqlite3_value **in_RSI;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  Fts5Storage *unaff_retaddr;
  int rc;
  Fts5Config *pConfig;
  sqlite3_stmt *pDel;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  char *iDel_00;
  undefined4 in_stack_ffffffffffffffd0;
  int bSaveRow_00;
  Fts5Storage *p_00;
  long lVar2;
  
  bSaveRow_00 = (int)((ulong)in_RDX >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iDel_00 = *(char **)in_RDI;
  p_00 = (Fts5Storage *)0x0;
  iVar1 = fts5StorageLoadTotals
                    ((Fts5Storage *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5IndexBeginWrite
                      ((Fts5Index *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       0x2871b5);
  }
  if (iVar1 == 0) {
    if (*(int *)(*(char **)in_RDI + 0x4c) == 0) {
      iVar1 = fts5StorageDeleteFromIndex(p_00,(i64)in_RDI,in_RSI,bSaveRow_00);
    }
    else {
      iVar1 = fts5StorageContentlessDelete
                        ((Fts5Storage *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),(i64)iDel_00);
      if (((iVar1 == 0) && (in_ECX != 0)) && (*(int *)(*(char **)in_RDI + 0x48) == 3)) {
        iVar1 = sqlite3Fts5StorageFindDeleteRow
                          ((Fts5Storage *)(ulong)in_stack_ffffffffffffffc0,
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
  }
  if (((iVar1 == 0) && (*(int *)(iDel_00 + 0x68) != 0)) &&
     (iVar1 = fts5StorageGetStmt(unaff_retaddr,(int)((ulong)lVar2 >> 0x20),(sqlite3_stmt **)p_00,
                                 (char **)in_RDI), iVar1 == 0)) {
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                       (int)((ulong)iDel_00 >> 0x20),(ulong)in_stack_ffffffffffffffc0);
    sqlite3_step(in_RDI);
    iVar1 = sqlite3_reset((sqlite3_stmt *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
  }
  if ((*(int *)(iDel_00 + 0x48) == 0) || (*(int *)(iDel_00 + 0x48) == 3)) {
    if (iVar1 == 0) {
      iVar1 = fts5StorageGetStmt(unaff_retaddr,(int)((ulong)lVar2 >> 0x20),(sqlite3_stmt **)p_00,
                                 (char **)in_RDI);
    }
    if (iVar1 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                         (int)((ulong)iDel_00 >> 0x20),(ulong)in_stack_ffffffffffffffc0);
      sqlite3_step(in_RDI);
      iVar1 = sqlite3_reset((sqlite3_stmt *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageDelete(
  Fts5Storage *p,                 /* Storage object */
  i64 iDel,                       /* Rowid to delete from table */
  sqlite3_value **apVal,          /* Optional - values to remove from index */
  int bSaveRow                    /* If true, set pSavedRow for deleted row */
){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 1, iDel);
  }

  if( rc==SQLITE_OK ){
    if( p->pConfig->bContentlessDelete ){
      rc = fts5StorageContentlessDelete(p, iDel);
      if( rc==SQLITE_OK
       && bSaveRow
       && p->pConfig->eContent==FTS5_CONTENT_UNINDEXED
      ){
        rc = sqlite3Fts5StorageFindDeleteRow(p, iDel);
      }
    }else{
      rc = fts5StorageDeleteFromIndex(p, iDel, apVal, bSaveRow);
    }
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL
   || pConfig->eContent==FTS5_CONTENT_UNINDEXED
  ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}